

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::StringFormatTask::~StringFormatTask(StringFormatTask *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~StringFormatTask((StringFormatTask *)0x994718);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

explicit StringFormatTask(KnownSystemName knownNameId) : SystemTaskBase(knownNameId) {
        hasOutputArgs = true;
    }